

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_path_or_unary_expression(xpath_parser *this)

{
  byte bVar1;
  xpath_variable_set *this_00;
  char_t *pcVar2;
  bool bVar3;
  lexeme_t lVar4;
  nodetest_t nVar5;
  xpath_lexer_string *pxVar6;
  char_t *pcVar7;
  xpath_variable *pxVar8;
  byte *pbVar9;
  xpath_parser *this_01;
  xpath_ast_node *pxVar10;
  xpath_ast_node *pxVar11;
  xpath_parse_result *pxVar12;
  char *pcVar13;
  xpath_value_type xVar14;
  anon_union_8_5_7bd254c6_for__data *paVar15;
  int iVar16;
  ast_type_t aVar17;
  xpath_lexer_string *in_RSI;
  xpath_ast_node *in_R8;
  char_t *in_R9;
  ulong uVar18;
  xpath_lexer *this_02;
  anon_union_8_5_7bd254c6_for__data *paVar19;
  xpath_ast_node *args [2];
  xpath_lexer_string local_48;
  xpath_lexer *local_38;
  
  paVar19 = (anon_union_8_5_7bd254c6_for__data *)args;
  lVar4 = (this->_lexer)._cur_lexeme;
  if (0xc < lVar4 - lex_minus) {
switchD_001116e6_caseD_9:
    pxVar10 = parse_location_path(this);
    return pxVar10;
  }
  this_02 = &this->_lexer;
  switch(lVar4) {
  case lex_minus:
    xpath_lexer::next(this_02);
    pxVar10 = parse_expression(this,7);
    if (pxVar10 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar10 = alloc_node(this,ast_op_negate,xpath_type_number,pxVar10,(xpath_ast_node *)0x0);
    return pxVar10;
  default:
    goto switchD_001116e6_caseD_9;
  case lex_var_ref:
    goto switchD_001116e6_caseD_b;
  case lex_open_brace:
    goto switchD_001116e6_caseD_c;
  case lex_quoted_string:
  case lex_number:
    break;
  case lex_string:
    pbVar9 = this_02->_cur;
    do {
      bVar1 = *pbVar9;
      pbVar9 = pbVar9 + 1;
    } while (((anonymous_namespace)::chartype_table[bVar1] & 8) != 0);
    if (bVar1 != 0x28) goto switchD_001116e6_caseD_9;
    this_01 = (xpath_parser *)xpath_lexer::contents(this_02);
    nVar5 = parse_node_test_type(this_01,in_RSI);
    if (nVar5 != nodetest_none) goto switchD_001116e6_caseD_9;
    lVar4 = (this->_lexer)._cur_lexeme;
  }
  switch(lVar4) {
  case lex_var_ref:
switchD_001116e6_caseD_b:
    pxVar6 = xpath_lexer::contents(this_02);
    this_00 = this->_variables;
    if (this_00 == (xpath_variable_set *)0x0) {
      pxVar12 = this->_result;
      pcVar13 = "Unknown variable: variable set is not provided";
    }
    else {
      pcVar2 = pxVar6->begin;
      uVar18 = (long)pxVar6->end - (long)pcVar2;
      pcVar7 = this->_scratch;
      local_38 = this_02;
      if ((0x1f < uVar18) &&
         (pcVar7 = (char_t *)
                   (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                             allocate)(uVar18 + 1), pcVar7 == (char_t *)0x0)) goto LAB_00111ac3;
      memcpy(pcVar7,pcVar2,uVar18);
      pcVar7[uVar18] = '\0';
      pxVar8 = xpath_variable_set::_find(this_00,pcVar7);
      if (pcVar7 != this->_scratch) {
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                  (pcVar7);
      }
      this_02 = local_38;
      if (pxVar8 != (xpath_variable *)0x0) {
        xpath_lexer::next(local_38);
        xVar14 = pxVar8->_type;
        pxVar10 = (xpath_ast_node *)alloc_node(this);
        if (pxVar10 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        pxVar10->_type = '\x14';
        pxVar10->_rettype = (char)xVar14;
        pxVar10->_axis = '\0';
        pxVar10->_test = '\0';
        goto LAB_001118ec;
      }
      pxVar12 = this->_result;
      pcVar13 = "Unknown variable: variable set does not contain the given name";
    }
    break;
  case lex_open_brace:
switchD_001116e6_caseD_c:
    xpath_lexer::next(this_02);
    pxVar10 = parse_expression(this,0);
    if (pxVar10 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    if ((this->_lexer)._cur_lexeme == lex_close_brace) {
      xpath_lexer::next(this_02);
      goto LAB_001119b7;
    }
    pxVar12 = this->_result;
    pcVar13 = "Expected \')\' to match an opening \'(\'";
    break;
  default:
    pxVar12 = this->_result;
    pcVar13 = "Unrecognizable primary expression";
    break;
  case lex_quoted_string:
    pxVar6 = xpath_lexer::contents(this_02);
    pxVar8 = (xpath_variable *)alloc_string(this,pxVar6);
    if (pxVar8 == (xpath_variable *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    xpath_lexer::next(this_02);
    pxVar10 = (xpath_ast_node *)alloc_node(this);
    if (pxVar10 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar10->_type = '\x12';
    pxVar10->_rettype = '\x03';
    pxVar10->_axis = '\0';
    pxVar10->_test = '\0';
LAB_001118ec:
    pxVar10->_left = (xpath_ast_node *)0x0;
    pxVar10->_right = (xpath_ast_node *)0x0;
    pxVar10->_next = (xpath_ast_node *)0x0;
    (pxVar10->_data).variable = pxVar8;
    goto LAB_001119b7;
  case lex_number:
    pxVar6 = xpath_lexer::contents(this_02);
    pcVar2 = pxVar6->begin;
    pxVar6 = xpath_lexer::contents(this_02);
    uVar18 = (long)pxVar6->end - (long)pcVar2;
    pcVar7 = this->_scratch;
    if ((0x1f < uVar18) &&
       (pcVar7 = (char_t *)
                 (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                           allocate)(uVar18 + 1), pcVar7 == (char_t *)0x0)) {
LAB_00111ac3:
      error_oom(this);
      return (xpath_ast_node *)0x0;
    }
    memcpy(pcVar7,pcVar2,uVar18);
    pcVar7[uVar18] = '\0';
    local_38 = (xpath_lexer *)convert_string_to_number(pcVar7);
    if (pcVar7 != this->_scratch) {
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (pcVar7);
    }
    xpath_lexer::next(this_02);
    pxVar10 = (xpath_ast_node *)alloc_node(this);
    if (pxVar10 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar10->_type = '\x13';
    pxVar10->_rettype = '\x02';
    pxVar10->_axis = '\0';
    pxVar10->_test = '\0';
    pxVar10->_next = (xpath_ast_node *)0x0;
    pxVar10->_left = (xpath_ast_node *)0x0;
    pxVar10->_right = (xpath_ast_node *)0x0;
    (pxVar10->_data).number = (double)local_38;
LAB_001119b7:
    while (lVar4 = (this->_lexer)._cur_lexeme, lVar4 == lex_open_square_brace) {
      xpath_lexer::next(this_02);
      if (pxVar10->_rettype != '\x01') {
        pxVar12 = this->_result;
        pcVar13 = "Predicate has to be applied to node set";
        goto LAB_00111b48;
      }
      pxVar11 = parse_expression(this,0);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar10 = alloc_node(this,ast_filter,pxVar10,pxVar11,(predicate_t)in_R8);
      if (pxVar10 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      if ((this->_lexer)._cur_lexeme != lex_close_square_brace) {
        pxVar12 = this->_result;
        pcVar13 = "Expected \']\' to match an opening \'[\'";
        goto LAB_00111b48;
      }
      xpath_lexer::next(this_02);
    }
    if ((lVar4 & ~lex_equal) != lex_slash) {
      return pxVar10;
    }
    xpath_lexer::next(this_02);
    if (lVar4 != lex_double_slash) {
LAB_00111b17:
      pxVar10 = parse_relative_location_path(this,pxVar10);
      return pxVar10;
    }
    if (pxVar10->_rettype == '\x01') {
      pxVar10 = alloc_node(this,(ast_type_t)pxVar10,(xpath_ast_node *)0x5,axis_attribute,
                           nodetest_none,in_R9);
      if (pxVar10 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      goto LAB_00111b17;
    }
    pxVar12 = this->_result;
    pcVar13 = "Step has to be applied to node set";
    break;
  case lex_string:
    args[0] = (xpath_ast_node *)0x0;
    args[1] = (xpath_ast_node *)0x0;
    pxVar6 = xpath_lexer::contents(this_02);
    local_48.begin = pxVar6->begin;
    local_48.end = pxVar6->end;
    xpath_lexer::next(this_02);
    if ((this->_lexer)._cur_lexeme == lex_open_brace) {
      xpath_lexer::next(this_02);
      pcVar13 = "No comma between function arguments";
      uVar18 = 0;
      pxVar10 = (xpath_ast_node *)0x0;
      while (lVar4 = (this->_lexer)._cur_lexeme, lVar4 != lex_close_brace) {
        if (uVar18 != 0) {
          if (lVar4 != lex_comma) goto switchD_00111bb9_caseD_64;
          xpath_lexer::next(this_02);
        }
        pxVar11 = parse_expression(this,0);
        if (pxVar11 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        paVar15 = (anon_union_8_5_7bd254c6_for__data *)&pxVar10->_next;
        if (uVar18 < 2) {
          paVar15 = paVar19;
        }
        uVar18 = uVar18 + 1;
        paVar19 = paVar19 + 1;
        paVar15->variable = (xpath_variable *)pxVar11;
        pxVar10 = pxVar11;
      }
      xpath_lexer::next(this_02);
      pcVar13 = "Unrecognized function or wrong parameter count";
      switch(*local_48.begin) {
      case 'b':
        bVar3 = xpath_lexer_string::operator==(&local_48,(char_t *)"boolean");
        if ((uVar18 == 1) && (bVar3)) {
          aVar17 = ast_func_boolean;
LAB_00111ffc:
          xVar14 = xpath_type_boolean;
          pxVar10 = args[0];
LAB_00112003:
          in_R8 = (xpath_ast_node *)0x0;
LAB_00112006:
          pxVar10 = alloc_node(this,aVar17,xVar14,pxVar10,in_R8);
          goto LAB_0011200e;
        }
        break;
      case 'c':
        bVar3 = xpath_lexer_string::operator==(&local_48,"count");
        if ((uVar18 == 1) && (bVar3)) {
          if (args[0]->_rettype != '\x01') goto LAB_0011215c;
          aVar17 = ast_func_count;
LAB_00111ee3:
          xVar14 = xpath_type_number;
          pxVar10 = args[0];
          goto LAB_00112003;
        }
        bVar3 = xpath_lexer_string::operator==(&local_48,(char_t *)"contains");
        if ((uVar18 == 2) && (bVar3)) {
          aVar17 = ast_func_contains;
LAB_00111fcb:
          xVar14 = xpath_type_boolean;
          pxVar10 = args[0];
          in_R8 = args[1];
          goto LAB_00112006;
        }
        bVar3 = xpath_lexer_string::operator==(&local_48,(char_t *)"concat");
        if ((1 < uVar18) && (bVar3)) {
          aVar17 = ast_func_concat;
          goto LAB_00112071;
        }
        bVar3 = xpath_lexer_string::operator==(&local_48,(char_t *)"ceiling");
        if ((uVar18 == 1) && (bVar3)) {
          aVar17 = ast_func_ceiling;
          goto LAB_00111ee3;
        }
        break;
      case 'f':
        bVar3 = xpath_lexer_string::operator==(&local_48,(char_t *)"false");
        if ((uVar18 == 0) && (bVar3)) {
          aVar17 = ast_func_false;
LAB_00111ea4:
          xVar14 = xpath_type_boolean;
LAB_00111ea7:
          pxVar10 = (xpath_ast_node *)0x0;
          goto LAB_00112003;
        }
        bVar3 = xpath_lexer_string::operator==(&local_48,(char_t *)"floor");
        if ((uVar18 == 1) && (bVar3)) {
          aVar17 = ast_func_floor;
          goto LAB_00111ee3;
        }
        break;
      case 'i':
        bVar3 = xpath_lexer_string::operator==(&local_48,"id");
        if ((uVar18 == 1) && (bVar3)) {
          aVar17 = ast_func_id;
          xVar14 = xpath_type_node_set;
          pxVar10 = args[0];
          goto LAB_00112003;
        }
        break;
      case 'l':
        bVar3 = xpath_lexer_string::operator==(&local_48,(char_t *)"last");
        if ((uVar18 == 0) && (bVar3)) {
          aVar17 = ast_func_last;
LAB_00111d40:
          xVar14 = xpath_type_number;
          goto LAB_00111ea7;
        }
        bVar3 = xpath_lexer_string::operator==(&local_48,"lang");
        if ((uVar18 == 1) && (bVar3)) {
          aVar17 = ast_func_lang;
          goto LAB_00111ffc;
        }
        bVar3 = xpath_lexer_string::operator==(&local_48,(char_t *)"local-name");
        if ((uVar18 < 2) && (bVar3)) {
          if ((uVar18 == 1) && (args[0]->_rettype != '\x01')) goto LAB_0011215c;
          iVar16 = 0x1a;
          goto LAB_00111f96;
        }
        break;
      case 'n':
        bVar3 = xpath_lexer_string::operator==(&local_48,"name");
        if ((uVar18 < 2) && (bVar3)) {
          if ((uVar18 != 1) || (args[0]->_rettype == '\x01')) {
            iVar16 = 0x1e;
            goto LAB_00111f96;
          }
        }
        else {
          bVar3 = xpath_lexer_string::operator==(&local_48,(char_t *)"namespace-uri");
          if ((1 < uVar18) || (!bVar3)) {
            bVar3 = xpath_lexer_string::operator==(&local_48,(char_t *)"normalize-space");
            if ((uVar18 < 2) && (bVar3)) {
              aVar17 = ast_func_normalize_space_1 - (uVar18 == 0);
              goto LAB_00112071;
            }
            bVar3 = xpath_lexer_string::operator==(&local_48,(char_t *)"not");
            if ((uVar18 == 1) && (bVar3)) {
              aVar17 = ast_func_not;
              goto LAB_00111ffc;
            }
            bVar3 = xpath_lexer_string::operator==(&local_48,"number");
            if ((uVar18 < 2) && (bVar3)) {
              iVar16 = 0x33;
              goto LAB_00111edb;
            }
            break;
          }
          if ((uVar18 != 1) || (args[0]->_rettype == '\x01')) {
            iVar16 = 0x1c;
            goto LAB_00111f96;
          }
        }
LAB_0011215c:
        pcVar13 = "Function has to be applied to node set";
        break;
      case 'p':
        bVar3 = xpath_lexer_string::operator==(&local_48,(char_t *)"position");
        if ((uVar18 == 0) && (bVar3)) {
          aVar17 = ast_func_position;
          goto LAB_00111d40;
        }
        break;
      case 'r':
        bVar3 = xpath_lexer_string::operator==(&local_48,(char_t *)"round");
        if ((uVar18 == 1) && (bVar3)) {
          aVar17 = ast_func_round;
          goto LAB_00111ee3;
        }
        break;
      case 's':
        bVar3 = xpath_lexer_string::operator==(&local_48,"string");
        if ((uVar18 < 2) && (bVar3)) {
          iVar16 = 0x20;
LAB_00111f96:
          aVar17 = iVar16 - (uint)(uVar18 == 0);
          xVar14 = xpath_type_string;
          pxVar10 = args[0];
          goto LAB_00112003;
        }
        bVar3 = xpath_lexer_string::operator==(&local_48,(char_t *)"string-length");
        if ((uVar18 < 2) && (bVar3)) {
          iVar16 = 0x29;
LAB_00111edb:
          aVar17 = iVar16 - (uint)(uVar18 == 0);
          goto LAB_00111ee3;
        }
        bVar3 = xpath_lexer_string::operator==(&local_48,(char_t *)"starts-with");
        if ((uVar18 == 2) && (bVar3)) {
          aVar17 = ast_func_starts_with;
          goto LAB_00111fcb;
        }
        bVar3 = xpath_lexer_string::operator==(&local_48,(char_t *)"substring-before");
        if ((uVar18 == 2) && (bVar3)) {
          aVar17 = ast_func_substring_before;
          goto LAB_00112071;
        }
        bVar3 = xpath_lexer_string::operator==(&local_48,(char_t *)"substring-after");
        if ((uVar18 == 2) && (bVar3)) {
          aVar17 = ast_func_substring_after;
LAB_0011210b:
          xVar14 = xpath_type_string;
          in_R8 = args[1];
        }
        else {
          bVar3 = xpath_lexer_string::operator==(&local_48,(char_t *)"substring");
          if (((uVar18 & 0xfffffffffffffffe) == 2) && (bVar3)) {
            aVar17 = uVar18 == 2 ^ ast_func_substring_3;
            goto LAB_0011210b;
          }
          bVar3 = xpath_lexer_string::operator==(&local_48,(char_t *)"sum");
          if ((uVar18 != 1) || (!bVar3)) break;
          if (args[0]->_rettype != '\x01') goto LAB_0011215c;
          aVar17 = ast_func_sum;
          xVar14 = xpath_type_number;
          in_R8 = (xpath_ast_node *)0x0;
        }
        pxVar10 = alloc_node(this,aVar17,xVar14,args[0],in_R8);
LAB_0011200e:
        if (pxVar10 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        goto LAB_001119b7;
      case 't':
        bVar3 = xpath_lexer_string::operator==(&local_48,(char_t *)"translate");
        if ((uVar18 == 3) && (bVar3)) {
          aVar17 = ast_func_translate;
LAB_00112071:
          xVar14 = xpath_type_string;
          pxVar10 = args[0];
          in_R8 = args[1];
          goto LAB_00112006;
        }
        bVar3 = xpath_lexer_string::operator==(&local_48,(char_t *)"true");
        if ((uVar18 == 0) && (bVar3)) {
          aVar17 = ast_func_true;
          goto LAB_00111ea4;
        }
      }
    }
    else {
      pcVar13 = "Unrecognized function call";
    }
switchD_00111bb9_caseD_64:
    pxVar12 = this->_result;
    pxVar12->error = pcVar13;
    goto LAB_00111b4b;
  }
LAB_00111b48:
  pxVar12->error = pcVar13;
LAB_00111b4b:
  pxVar12->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
  return (xpath_ast_node *)0x0;
}

Assistant:

xpath_ast_node* parse_path_or_unary_expression()
		{
			// Clarification.
			// PathExpr begins with either LocationPath or FilterExpr.
			// FilterExpr begins with PrimaryExpr
			// PrimaryExpr begins with '$' in case of it being a variable reference,
			// '(' in case of it being an expression, string literal, number constant or
			// function call.
			if (_lexer.current() == lex_var_ref || _lexer.current() == lex_open_brace ||
				_lexer.current() == lex_quoted_string || _lexer.current() == lex_number ||
				_lexer.current() == lex_string)
			{
				if (_lexer.current() == lex_string)
				{
					// This is either a function call, or not - if not, we shall proceed with location path
					const char_t* state = _lexer.state();

					while (PUGI__IS_CHARTYPE(*state, ct_space)) ++state;

					if (*state != '(')
						return parse_location_path();

					// This looks like a function call; however this still can be a node-test. Check it.
					if (parse_node_test_type(_lexer.contents()) != nodetest_none)
						return parse_location_path();
				}

				xpath_ast_node* n = parse_filter_expression();
				if (!n) return 0;

				if (_lexer.current() == lex_slash || _lexer.current() == lex_double_slash)
				{
					lexeme_t l = _lexer.current();
					_lexer.next();

					if (l == lex_double_slash)
					{
						if (n->rettype() != xpath_type_node_set)
							return error("Step has to be applied to node set");

						n = alloc_node(ast_step, n, axis_descendant_or_self, nodetest_type_node, 0);
						if (!n) return 0;
					}

					// select from location path
					return parse_relative_location_path(n);
				}

				return n;
			}
			else if (_lexer.current() == lex_minus)
			{
				_lexer.next();

				// precedence 7+ - only parses union expressions
				xpath_ast_node* n = parse_expression(7);
				if (!n) return 0;

				return alloc_node(ast_op_negate, xpath_type_number, n);
			}
			else
			{
				return parse_location_path();
			}
		}